

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall S2Loop::InitIndex(S2Loop *this)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_48;
  S2LogMessageVoidify local_35 [13];
  S2Loop *local_28;
  unique_ptr<S2Loop::Shape,_std::default_delete<S2Loop::Shape>_> local_20;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_18;
  S2Loop *local_10;
  S2Loop *this_local;
  
  local_28 = this;
  local_10 = this;
  absl::make_unique<S2Loop::Shape,S2Loop*>((absl *)&local_20,&local_28);
  std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
  unique_ptr<S2Loop::Shape,std::default_delete<S2Loop::Shape>,void>
            ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)&local_18,&local_20);
  MutableS2ShapeIndex::Add(&this->index_,&local_18);
  std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(&local_18);
  std::unique_ptr<S2Loop::Shape,_std::default_delete<S2Loop::Shape>_>::~unique_ptr(&local_20);
  if ((FLAGS_s2loop_lazy_indexing & 1U) == 0) {
    MutableS2ShapeIndex::ForceBuild(&this->index_);
  }
  if ((((FLAGS_s2debug & 1U) != 0) && (this->s2debug_override_ == ALLOW)) &&
     (bVar1 = IsValid(this), ((bVar1 ^ 0xffU) & 1) != 0)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x11c,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_48);
    poVar2 = std::operator<<(poVar2,"Check failed: IsValid() ");
    S2LogMessageVoidify::operator&(local_35,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  return;
}

Assistant:

void S2Loop::InitIndex() {
  index_.Add(make_unique<Shape>(this));
  if (!FLAGS_s2loop_lazy_indexing) {
    index_.ForceBuild();
  }
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    // Note that FLAGS_s2debug is false in optimized builds (by default).
    S2_CHECK(IsValid());
  }
}